

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O3

QRect __thiscall QtMWidgets::SliderPrivate::grooveRect(SliderPrivate *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  QRect QVar8;
  
  auVar7 = QWidget::contentsRect();
  iVar1 = QAbstractSlider::orientation();
  uVar6 = auVar7._0_4_;
  uVar3 = auVar7._4_4_;
  if (iVar1 == 2) {
    iVar1 = this->grooveHeight;
    iVar4 = (auVar7._8_4_ - iVar1) - uVar6;
    iVar2 = ((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1) + uVar6;
    iVar5 = uVar3 + 1;
    iVar4 = ~uVar3 + auVar7._12_4_;
  }
  else {
    iVar2 = uVar6 + 1;
    iVar4 = this->grooveHeight;
    iVar1 = (auVar7._12_4_ - iVar4) - uVar3;
    iVar5 = ((iVar1 - (iVar1 + 1 >> 0x1f)) + 1 >> 1) + uVar3;
    iVar1 = ~uVar6 + auVar7._8_4_;
  }
  QVar8.x2 = iVar1 + iVar2 + -1;
  QVar8.y1 = iVar5;
  QVar8.x1 = iVar2;
  QVar8.y2 = iVar4 + iVar5 + -1;
  return QVar8;
}

Assistant:

QRect
SliderPrivate::grooveRect() const
{
	const QRect cr = q->contentsRect();

	int gx = 0, gy = 0, gw = 0, gh = 0;

	if( q->orientation() == Qt::Vertical )
	{
		gx = cr.topLeft().x() + ( cr.width() - grooveHeight ) / 2;
		gy = cr.topLeft().y() + 1;
		gw = grooveHeight;
		gh = cr.height() - 2;
	}
	else
	{
		gx = cr.topLeft().x() + 1;
		gy = cr.topLeft().y() + ( cr.height() - grooveHeight ) / 2;
		gw = cr.width() - 2;
		gh = grooveHeight;
	}

	return QRect( gx, gy, gw, gh );
}